

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O2

int __thiscall
zmq::null_mechanism_t::process_error_command
          (null_mechanism_t *this,uchar *cmd_data_,size_t data_size_)

{
  int iVar1;
  socket_base_t *this_00;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  int *piVar2;
  
  if ((data_size_ < 7) || (data_size_ - 7 < (ulong)cmd_data_[6])) {
    this_00 = session_base_t::get_socket(*(session_base_t **)&this->field_0x5e0);
    endpoint_uri_pair_ = session_base_t::get_endpoint(*(session_base_t **)&this->field_0x5e0);
    socket_base_t::event_handshake_failed_protocol(this_00,endpoint_uri_pair_,0x10000015);
    piVar2 = __errno_location();
    *piVar2 = 0x47;
    iVar1 = -1;
  }
  else {
    mechanism_base_t::handle_error_reason
              ((mechanism_base_t *)&(this->super_zap_client_t).field_0x50,(char *)(cmd_data_ + 7),
               (ulong)cmd_data_[6]);
    (this->super_zap_client_t).field_0x4b = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int zmq::null_mechanism_t::process_error_command (
  const unsigned char *cmd_data_, size_t data_size_)
{
    const size_t fixed_prefix_size =
      error_command_name_len + error_reason_len_size;
    if (data_size_ < fixed_prefix_size) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MALFORMED_COMMAND_ERROR);

        errno = EPROTO;
        return -1;
    }
    const size_t error_reason_len =
      static_cast<size_t> (cmd_data_[error_command_name_len]);
    if (error_reason_len > data_size_ - fixed_prefix_size) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MALFORMED_COMMAND_ERROR);

        errno = EPROTO;
        return -1;
    }
    const char *error_reason =
      reinterpret_cast<const char *> (cmd_data_) + fixed_prefix_size;
    handle_error_reason (error_reason, error_reason_len);
    _error_command_received = true;
    return 0;
}